

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdPrintHex(FILE *pFile,uint *pTruth,int nFans)

{
  uint uVar1;
  int local_28;
  int k;
  int Digit;
  int nDigits;
  int nFans_local;
  uint *pTruth_local;
  FILE *pFile_local;
  
  local_28 = (1 << ((byte)nFans & 0x1f)) / 4;
  while (local_28 = local_28 + -1, -1 < local_28) {
    uVar1 = pTruth[local_28 / 8] >> ((byte)(local_28 % 8 << 2) & 0x1f) & 0xf;
    if (uVar1 < 10) {
      fprintf((FILE *)pFile,"%d",(ulong)uVar1);
    }
    else {
      fprintf((FILE *)pFile,"%c",(ulong)(uVar1 + 0x37));
    }
  }
  return;
}

Assistant:

void Kit_DsdPrintHex( FILE * pFile, unsigned * pTruth, int nFans )
{
    int nDigits, Digit, k;
    nDigits = (1 << nFans) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
}